

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall glslang::TVarSetTraverser::visitSymbol(TVarSetTraverser *this,TIntermSymbol *base)

{
  byte bVar1;
  _Rb_tree_color _Var2;
  uint uVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  const_iterator cVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  
  iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
  lVar6 = 0xd0;
  if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 3) {
    iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
    lVar6 = 0xd8;
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0x7f) != 4) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
      lVar6 = 0xe0;
      if (1 < (*(uint *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x7f) - 5) {
        return;
      }
    }
  }
  this_00 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
              **)((long)&(this->super_TLiveTraverser).super_TIntermTraverser._vptr_TIntermTraverser
                 + lVar6);
  iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(base);
  iVar5 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(base);
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
          ::find(this_00,(key_type *)CONCAT44(extraout_var_03,iVar5));
  if (((_Rb_tree_header *)cVar7._M_node != &(this_00->_M_impl).super__Rb_tree_header) &&
     (cVar7._M_node[2]._M_parent == (_Base_ptr)CONCAT44(extraout_var_02,iVar4))) {
    _Var2 = cVar7._M_node[3]._M_color;
    if (_Var2 != ~_S_red) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_04,iVar4));
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffff0000ffffffff | (ulong)(_Var2 & 0xffff) << 0x20;
    }
    uVar3 = *(uint *)&cVar7._M_node[3].field_0x4;
    if (uVar3 != 0xffffffff) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_05,iVar4));
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffffffffffc07fff | (ulong)((uVar3 & 0x7f) << 0xf);
    }
    uVar3 = *(uint *)&cVar7._M_node[3]._M_parent;
    if (uVar3 != 0xffffffff) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_06,iVar4));
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xfffffffffffff000 | (ulong)(uVar3 & 0xfff);
    }
    uVar3 = *(uint *)((long)&cVar7._M_node[3]._M_parent + 4);
    if (uVar3 != 0xffffffff) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_07,iVar4));
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffffffffffff8fff | (ulong)((uVar3 & 7) << 0xc);
    }
    iVar4 = *(int *)&cVar7._M_node[3]._M_left;
    if (iVar4 != -1) {
      iVar5 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x50))
                        ((long *)CONCAT44(extraout_var_08,iVar5));
      *(char *)(lVar6 + 0x22) = (char)iVar4;
    }
    if (*(int *)((long)&cVar7._M_node[2]._M_right + 4) != 0) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_09,iVar4));
      *(undefined1 *)(lVar6 + 0x2d) = 1;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_10,iVar4));
      *(undefined1 *)(lVar6 + 0x2d) = 1;
      *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffffffff80 | 5;
      *(ulong *)(lVar6 + 0x1c) = *(ulong *)(lVar6 + 0x1c) & 0xffff0000ffc07fff | 0xffff001f8000;
      bVar1 = *(byte *)((long)&cVar7._M_node[2]._M_right + 4);
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_11,iVar4));
      *(byte *)(lVar6 + 0x10) = *(byte *)(lVar6 + 0x10) & 0xf0 | bVar1 & 0xf;
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* base) {
        const TVarLiveMap* source;
        if (base->getQualifier().storage == EvqVaryingIn)
            source = &inputList;
        else if (base->getQualifier().storage == EvqVaryingOut)
            source = &outputList;
        else if (base->getQualifier().isUniformOrBuffer())
            source = &uniformList;
        else
            return;

        TVarEntryInfo ent = { base->getId(), {}, {}, {}, {}, {}, {}, {}, {}, {} };
        // Fix a defect, when block has no instance name, we need to find its block name
        TVarLiveMap::const_iterator at = source->find(base->getAccessName());
        if (at == source->end())
            return;

        if (at->second.id != ent.id)
            return;

        if (at->second.newBinding != -1)
            base->getWritableType().getQualifier().layoutBinding = at->second.newBinding;
        if (at->second.newSet != -1)
            base->getWritableType().getQualifier().layoutSet = at->second.newSet;
        if (at->second.newLocation != -1)
            base->getWritableType().getQualifier().layoutLocation = at->second.newLocation;
        if (at->second.newComponent != -1)
            base->getWritableType().getQualifier().layoutComponent = at->second.newComponent;
        if (at->second.newIndex != -1)
            base->getWritableType().getQualifier().layoutIndex = at->second.newIndex;
        if (at->second.upgradedToPushConstantPacking != ElpNone) {
            base->getWritableType().getQualifier().layoutPushConstant = true;
            base->getWritableType().getQualifier().setBlockStorage(EbsPushConstant);
            base->getWritableType().getQualifier().layoutPacking = at->second.upgradedToPushConstantPacking;
        }
    }